

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void CopyPlane_16(uint16_t *src_y,int src_stride_y,uint16_t *dst_y,int dst_stride_y,int width,
                 int height)

{
  int in_ECX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  _func_void_uint16_t_ptr_uint16_t_ptr_int *CopyRow;
  int y;
  uint16_t *in_stack_ffffffffffffffc8;
  code *src;
  int local_28;
  int local_24;
  
  src = CopyRow_16_C;
  local_24 = in_R9D;
  if ((in_ESI == in_R8D) && (in_ECX == in_R8D)) {
    local_24 = 1;
  }
  for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
    CopyRow_16_C((uint16_t *)src,in_stack_ffffffffffffffc8,0);
  }
  return;
}

Assistant:

LIBYUV_API
void CopyPlane_16(const uint16_t* src_y,
                  int src_stride_y,
                  uint16_t* dst_y,
                  int dst_stride_y,
                  int width,
                  int height) {
  int y;
  void (*CopyRow)(const uint16_t* src, uint16_t* dst, int width) = CopyRow_16_C;
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_COPYROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_SSE2;
  }
#endif
#if defined(HAS_COPYROW_16_ERMS)
  if (TestCpuFlag(kCpuHasERMS)) {
    CopyRow = CopyRow_16_ERMS;
  }
#endif
#if defined(HAS_COPYROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 32)) {
    CopyRow = CopyRow_16_NEON;
  }
#endif

  // Copy plane
  for (y = 0; y < height; ++y) {
    CopyRow(src_y, dst_y, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
}